

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void container_printf(container_t *c,uint8_t type)

{
  ushort uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  bool bVar5;
  undefined7 in_register_00000031;
  char *__format;
  ulong uVar6;
  
  uVar4 = (uint)CONCAT71(in_register_00000031,type);
  if (uVar4 == 4) {
    uVar4 = (uint)*(byte *)((long)c + 8);
    if (*(byte *)((long)c + 8) == 4) {
      __assert_fail("*type != SHARED_CONTAINER_TYPE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1062,
                    "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
    }
    c = *c;
  }
  if ((char)uVar4 == '\x03') {
    if (0 < ((array_container_t *)c)->cardinality) {
      lVar3 = 0;
      do {
        uVar1 = ((array_container_t *)c)->array[lVar3 * 2];
        printf("[%d,%d]",(ulong)uVar1,
               (ulong)((uint)((array_container_t *)c)->array[lVar3 * 2 + 1] + (uint)uVar1));
        lVar3 = lVar3 + 1;
      } while (lVar3 < ((array_container_t *)c)->cardinality);
    }
    return;
  }
  if ((uVar4 & 0xff) != 2) {
    putchar(0x7b);
    bVar5 = true;
    lVar3 = 0;
    uVar4 = 0;
    do {
      for (uVar6 = *(ulong *)(((array_container_t *)c)->array + lVar3 * 4); uVar6 != 0;
          uVar6 = uVar6 & uVar6 - 1) {
        lVar2 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        __format = ",%u";
        if (bVar5) {
          __format = "%u";
          bVar5 = false;
        }
        printf(__format,(ulong)((uint)lVar2 | uVar4));
      }
      uVar4 = uVar4 + 0x40;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x400);
    putchar(0x7d);
    return;
  }
  array_container_printf((array_container_t *)c);
  return;
}

Assistant:

static inline const container_t *container_unwrap_shared(
    const container_t *candidate_shared_container, uint8_t *type
){
    if (*type == SHARED_CONTAINER_TYPE) {
        *type = const_CAST_shared(candidate_shared_container)->typecode;
        assert(*type != SHARED_CONTAINER_TYPE);
        return const_CAST_shared(candidate_shared_container)->container;
    } else {
        return candidate_shared_container;
    }
}